

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  bool bVar1;
  IResultCapture *pIVar2;
  long in_RDI;
  
  bVar1 = uncaught_exceptions();
  if ((!bVar1) && ((*(byte *)(in_RDI + 0x48) & 1) == 0)) {
    pIVar2 = getResultCapture();
    (*pIVar2->_vptr_IResultCapture[7])(pIVar2,in_RDI);
  }
  MessageInfo::~MessageInfo((MessageInfo *)0x30b680);
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        if ( !uncaught_exceptions() && !m_moved ){
            getResultCapture().popScopedMessage(m_info);
        }
    }